

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O1

int VP8LBackwardReferencesTraceBackwards
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs_src,VP8LBackwardRefs *refs_dst)

{
  float fVar1;
  ushort uVar2;
  int iVar3;
  uint32_t *puVar4;
  CostInterval *pCVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  CostCacheInterval *cur;
  ushort *ptr;
  double *output;
  CostManager *manager;
  VP8LHistogram *p;
  CostCacheInterval *pCVar10;
  float *pfVar11;
  ulong uVar12;
  CostInterval *pCVar13;
  ushort *puVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  CostInterval *pCVar18;
  CostInterval *pCVar19;
  uint32_t uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  uint uVar25;
  CostManager *pCVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  uint64_t nmemb;
  ushort *puVar30;
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  VP8LColorCache hashers;
  double local_a8;
  VP8LColorCache local_88;
  VP8LRefsCursor local_78;
  double *local_60;
  uint64_t local_58;
  VP8LBackwardRefs *local_50;
  VP8LHashChain *local_48;
  CostInterval *local_40;
  double *local_38;
  
  uVar22 = ysize * xsize;
  nmemb = (uint64_t)(int)uVar22;
  local_48 = hash_chain;
  ptr = (ushort *)WebPSafeMalloc(nmemb,2);
  if (ptr != (ushort *)0x0) {
    iVar8 = (1 << ((byte)cache_bits & 0x1f)) + 0x118;
    bVar6 = cache_bits < 1;
    if (cache_bits < 1) {
      iVar8 = 0x118;
    }
    local_50 = refs_src;
    output = (double *)WebPSafeCalloc(1,(long)iVar8 * 8 + 0x1948);
    manager = (CostManager *)WebPSafeMalloc(1,0x8178);
    bVar24 = true;
    if (manager == (CostManager *)0x0 || output == (double *)0x0) {
LAB_0014a793:
      iVar8 = 0;
    }
    else {
      output[0x328] = (double)(output + 0x329);
      if (cache_bits < 1) {
        iVar8 = 0;
      }
      else {
        iVar8 = VP8LColorCacheInit(&local_88,cache_bits);
        if (iVar8 == 0) goto LAB_0014a793;
      }
      VP8LRefsCursorInit(&local_78,local_50);
      p = VP8LAllocateHistogram(cache_bits);
      if (p == (VP8LHistogram *)0x0) {
        VP8LFreeHistogram((VP8LHistogram *)0x0);
      }
      else {
        local_60 = output;
        local_58 = nmemb;
        VP8LHistogramInit(p,cache_bits,1);
        if (local_78.cur_pos != (PixOrCopy *)0x0) {
          do {
            VP8LHistogramAddSinglePixOrCopy(p,local_78.cur_pos,VP8LDistanceToPlaneCode,xsize);
            local_78.cur_pos = local_78.cur_pos + 1;
            if (local_78.cur_pos == local_78.last_pos_) {
              VP8LRefsCursorNextBlock(&local_78);
            }
          } while (local_78.cur_pos != (PixOrCopy *)0x0);
        }
        output = local_60;
        iVar17 = (1 << ((byte)p->palette_code_bits_ & 0x1f)) + 0x118;
        if (p->palette_code_bits_ < 1) {
          iVar17 = 0x118;
        }
        ConvertPopulationCountTableToBitEstimates(iVar17,p->literal_,(double *)local_60[0x328]);
        ConvertPopulationCountTableToBitEstimates(0x100,p->red_,output + 0x100);
        ConvertPopulationCountTableToBitEstimates(0x100,p->blue_,output + 0x200);
        ConvertPopulationCountTableToBitEstimates(0x100,p->alpha_,output);
        local_38 = output + 0x300;
        ConvertPopulationCountTableToBitEstimates(0x28,p->distance_,local_38);
        VP8LFreeHistogram(p);
        nmemb = local_58;
        manager->costs_ = (float *)0x0;
        manager->cache_intervals_ = (CostCacheInterval *)0x0;
        manager->head_ = (CostInterval *)0x0;
        manager->count_ = 0;
        manager->dist_array_ = ptr;
        manager->free_intervals_ = (CostInterval *)0x0;
        manager->recycled_intervals_ = (CostInterval *)0x0;
        pCVar13 = (CostInterval *)(manager->cost_cache_ + 0xffd);
        lVar21 = 10;
        pCVar18 = (CostInterval *)0x0;
        do {
          pCVar13[1].next_ = pCVar18;
          pCVar13 = pCVar13 + 1;
          lVar21 = lVar21 + -1;
          pCVar18 = pCVar13;
        } while (lVar21 != 0);
        uVar29 = 0xfff;
        if ((int)uVar22 < 0xfff) {
          uVar29 = (ulong)uVar22;
        }
        manager->free_intervals_ = pCVar13;
        manager->cache_intervals_size_ = 1;
        dVar33 = output[0x328];
        manager->cost_cache_[0] = *(double *)((long)dVar33 + 0x800) + 0.0;
        if (1 < (int)uVar22) {
          uVar12 = 0;
          do {
            uVar15 = uVar12 + 1;
            if (uVar15 < 0x200) {
              uVar27 = (uint)kPrefixEncodeCode[uVar12 + 1].code_;
              uVar25 = (uint)kPrefixEncodeCode[uVar12 + 1].extra_bits_;
            }
            else {
              uVar27 = 0x1f;
              uVar23 = (uint)uVar12;
              if (uVar23 != 0) {
                for (; uVar23 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                }
              }
              uVar25 = 0x1e - (uVar27 ^ 0x1f);
              uVar27 = (uint)((uVar23 >> (uVar25 & 0x1f) & 1) != 0) + (uVar27 ^ 0x1f) * 2 ^ 0x3e;
            }
            dVar31 = (double)(int)uVar25 + *(double *)((long)dVar33 + 0x800 + (long)(int)uVar27 * 8)
            ;
            manager->cost_cache_[uVar12 + 1] = dVar31;
            if ((dVar31 != manager->cost_cache_[uVar12]) ||
               (NAN(dVar31) || NAN(manager->cost_cache_[uVar12]))) {
              manager->cache_intervals_size_ = manager->cache_intervals_size_ + 1;
            }
            uVar12 = uVar15;
          } while (uVar29 - 1 != uVar15);
        }
        pCVar10 = (CostCacheInterval *)WebPSafeMalloc(manager->cache_intervals_size_,0x10);
        manager->cache_intervals_ = pCVar10;
        if (pCVar10 != (CostCacheInterval *)0x0) {
          pCVar10->start_ = 0;
          pCVar10->end_ = 1;
          pCVar10->cost_ = manager->cost_cache_[0];
          if (1 < (int)uVar22) {
            lVar21 = 0;
            do {
              dVar33 = manager->cost_cache_[lVar21 + 1];
              if ((dVar33 != pCVar10->cost_) || (NAN(dVar33) || NAN(pCVar10->cost_))) {
                pCVar10[1].start_ = (int)lVar21 + 1;
                pCVar10[1].cost_ = dVar33;
                pCVar10 = pCVar10 + 1;
              }
              pCVar10->end_ = (int)lVar21 + 2;
              lVar21 = lVar21 + 1;
            } while (uVar29 - 1 != lVar21);
          }
          pfVar11 = (float *)WebPSafeMalloc(nmemb,4);
          manager->costs_ = pfVar11;
          auVar7 = _DAT_0014ebb0;
          if (pfVar11 != (float *)0x0) {
            if (0 < (int)uVar22) {
              lVar21 = nmemb - 1;
              auVar32._8_4_ = (int)lVar21;
              auVar32._0_8_ = lVar21;
              auVar32._12_4_ = (int)((ulong)lVar21 >> 0x20);
              uVar29 = 0;
              auVar32 = auVar32 ^ _DAT_0014ebb0;
              auVar34 = _DAT_001501b0;
              auVar35 = _DAT_0014d980;
              do {
                auVar36 = auVar35 ^ auVar7;
                iVar17 = auVar32._4_4_;
                if ((bool)(~(auVar36._4_4_ == iVar17 && auVar32._0_4_ < auVar36._0_4_ ||
                            iVar17 < auVar36._4_4_) & 1)) {
                  pfVar11[uVar29] = 1e+38;
                }
                if ((auVar36._12_4_ != auVar32._12_4_ || auVar36._8_4_ <= auVar32._8_4_) &&
                    auVar36._12_4_ <= auVar32._12_4_) {
                  pfVar11[uVar29 + 1] = 1e+38;
                }
                auVar36 = auVar34 ^ auVar7;
                iVar9 = auVar36._4_4_;
                if (iVar9 <= iVar17 && (iVar9 != iVar17 || auVar36._0_4_ <= auVar32._0_4_)) {
                  pfVar11[uVar29 + 2] = 1e+38;
                  pfVar11[uVar29 + 3] = 1e+38;
                }
                uVar29 = uVar29 + 4;
                lVar21 = auVar35._8_8_;
                auVar35._0_8_ = auVar35._0_8_ + 4;
                auVar35._8_8_ = lVar21 + 4;
                lVar21 = auVar34._8_8_;
                auVar34._0_8_ = auVar34._0_8_ + 4;
                auVar34._8_8_ = lVar21 + 4;
              } while ((uVar22 + 3 & 0xfffffffc) != uVar29);
            }
            *ptr = 0;
            uVar27 = *argb;
            if (cache_bits < 1) {
              uVar23 = 0xffffffff;
            }
            else {
              uVar23 = uVar27 * 0x1e35a7bd >> ((byte)local_88.hash_shift_ & 0x1f);
              if (local_88.colors_[(int)uVar23] != uVar27) {
                uVar23 = 0xffffffff;
              }
            }
            if ((int)uVar23 < 0) {
              if (0 < cache_bits) {
                local_88.colors_[(int)(uVar27 * 0x1e35a7bd >> ((byte)local_88.hash_shift_ & 0x1f))]
                     = uVar27;
              }
              dVar33 = (output[uVar27 >> 0x18] +
                        *(double *)((long)output + (ulong)(uVar27 >> 0xd & 0x7f8) + 0x800) +
                        *(double *)((long)output[0x328] + (ulong)(uVar27 >> 8 & 0xff) * 8) +
                       output[(ulong)(uVar27 & 0xff) + 0x200]) * 0.82;
            }
            else {
              dVar33 = *(double *)((long)output[0x328] + (long)(int)(uVar23 + 0x118) * 8) * 0.68;
            }
            if (dVar33 + 0.0 < (double)*pfVar11) {
              *pfVar11 = (float)(dVar33 + 0.0);
              *ptr = 1;
            }
            if (1 < (int)uVar22) {
              pCVar13 = manager->intervals_ + 9;
              local_a8 = -1.0;
              iVar17 = 0;
              uVar29 = 1;
              iVar9 = -1;
              uVar22 = 0xffffffff;
              uVar27 = 0xffffffff;
              local_40 = pCVar13;
              do {
                uVar23 = argb[uVar29];
                uVar25 = 0xffffffff;
                if ((0 < cache_bits) &&
                   (uVar25 = uVar23 * 0x1e35a7bd >> ((byte)local_88.hash_shift_ & 0x1f),
                   local_88.colors_[(int)uVar25] != uVar23)) {
                  uVar25 = 0xffffffff;
                }
                puVar4 = local_48->offset_length_;
                uVar28 = puVar4[uVar29];
                pfVar11 = manager->costs_;
                fVar1 = pfVar11[uVar29 - 1];
                if ((int)uVar25 < 0) {
                  if (0 < cache_bits) {
                    local_88.colors_
                    [(int)(uVar23 * 0x1e35a7bd >> ((byte)local_88.hash_shift_ & 0x1f))] = uVar23;
                  }
                  dVar33 = (local_60[uVar23 >> 0x18] +
                            *(double *)((long)local_60 + (ulong)(uVar23 >> 0xd & 0x7f8) + 0x800) +
                            *(double *)((long)local_60[0x328] + (ulong)(uVar23 >> 8 & 0xff) * 8) +
                           local_60[(ulong)(uVar23 & 0xff) + 0x200]) * 0.82;
                }
                else {
                  dVar33 = *(double *)((long)local_60[0x328] + (long)(int)(uVar25 + 0x118) * 8) *
                           0.68;
                }
                dVar33 = dVar33 + (double)fVar1;
                if (dVar33 < (double)pfVar11[uVar29]) {
                  pfVar11[uVar29] = (float)dVar33;
                  ptr[uVar29] = 1;
                }
                uVar25 = uVar28 >> 0xc;
                uVar28 = uVar28 & 0xfff;
                uVar23 = (uint)uVar29;
                if (1 < uVar28) {
                  if (uVar25 == uVar22) {
                    if (iVar9 != 0) {
                      iVar17 = (uVar23 - 2) + uVar27;
                    }
                    iVar9 = 0;
                    if (iVar17 < (int)(uVar23 + uVar28 + -1)) {
                      uVar22 = 0;
                      uVar12 = uVar29;
                      if ((long)uVar29 <= (long)iVar17) {
                        do {
                          lVar21 = uVar12 + 1;
                          if (puVar4[lVar21] >> 0xc != uVar25) {
                            uVar22 = puVar4[uVar12 & 0xffffffff] & 0xfff;
                            uVar23 = (uint)uVar12;
                            goto LAB_0014af45;
                          }
                          bVar24 = (long)uVar12 < (long)iVar17;
                          uVar12 = uVar12 + 1;
                        } while (bVar24);
                        uVar22 = puVar4[lVar21] & 0xfff;
                        uVar23 = iVar17 + 1;
                      }
LAB_0014af45:
                      iVar17 = uVar23 - 1;
                      pCVar13 = manager->head_;
                      pCVar18 = pCVar13;
                      if (pCVar13 != (CostInterval *)0x0) {
                        do {
                          if ((int)uVar23 <= pCVar18->start_) break;
                          pCVar19 = pCVar18->next_;
                          if (((int)uVar23 <= pCVar18->end_) && (pCVar18->cost_ < pfVar11[iVar17]))
                          {
                            iVar9 = pCVar18->index_;
                            pfVar11[iVar17] = pCVar18->cost_;
                            manager->dist_array_[iVar17] = ((short)iVar17 - (short)iVar9) + 1;
                          }
                          pCVar18 = pCVar19;
                        } while (pCVar19 != (CostInterval *)0x0);
                        do {
                          if ((int)uVar23 < pCVar13->start_) break;
                          pCVar18 = pCVar13->next_;
                          if (((int)uVar23 < pCVar13->end_) && (pCVar13->cost_ < pfVar11[uVar23])) {
                            iVar9 = pCVar13->index_;
                            pfVar11[uVar23] = pCVar13->cost_;
                            manager->dist_array_[uVar23] = ((short)uVar23 - (short)iVar9) + 1;
                          }
                          pCVar13 = pCVar18;
                        } while (pCVar18 != (CostInterval *)0x0);
                      }
                      PushInterval(manager,(double)pfVar11[iVar17] + local_a8,uVar23,uVar22);
                      iVar17 = iVar17 + uVar22;
                      iVar9 = 0;
                      pCVar13 = local_40;
                    }
                  }
                  else {
                    iVar9 = VP8LDistanceToPlaneCode(xsize,uVar25);
                    if (iVar9 < 0x200) {
                      uVar22 = (uint)kPrefixEncodeCode[iVar9].code_;
                      uVar16 = (uint)kPrefixEncodeCode[iVar9].extra_bits_;
                    }
                    else {
                      uVar27 = iVar9 - 1;
                      uVar22 = 0x1f;
                      if (uVar27 != 0) {
                        for (; uVar27 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                        }
                      }
                      uVar16 = 0x1e - (uVar22 ^ 0x1f);
                      uVar22 = (uint)((uVar27 >> (uVar16 & 0x1f) & 1) != 0) + (uVar22 ^ 0x1f) * 2 ^
                               0x3e;
                    }
                    local_a8 = (double)(int)uVar16 + local_38[(int)uVar22];
                    PushInterval(manager,(double)fVar1 + local_a8,uVar23,uVar28);
                    iVar9 = 1;
                  }
                }
                pCVar18 = manager->head_;
                while ((pCVar19 = pCVar18, pCVar19 != (CostInterval *)0x0 &&
                       ((long)pCVar19->start_ <= (long)uVar29))) {
                  pCVar18 = pCVar19->next_;
                  if ((long)uVar29 < (long)pCVar19->end_) {
                    if (pCVar19->cost_ < manager->costs_[uVar29]) {
                      iVar3 = pCVar19->index_;
                      manager->costs_[uVar29] = pCVar19->cost_;
                      manager->dist_array_[uVar29] = ((short)uVar29 - (short)iVar3) + 1;
                    }
                  }
                  else {
                    pCVar5 = pCVar19->previous_;
                    pCVar26 = (CostManager *)&pCVar5->next_;
                    if (pCVar5 == (CostInterval *)0x0) {
                      pCVar26 = manager;
                    }
                    pCVar26->head_ = pCVar18;
                    if (pCVar18 != (CostInterval *)0x0) {
                      pCVar18->previous_ = pCVar5;
                    }
                    bVar24 = pCVar13 < pCVar19 || pCVar19 < manager->intervals_;
                    pCVar19->next_ = (&manager->free_intervals_)[bVar24];
                    (&manager->free_intervals_)[bVar24] = pCVar19;
                    manager->count_ = manager->count_ + -1;
                  }
                }
                uVar29 = uVar29 + 1;
                uVar22 = uVar25;
                uVar27 = uVar28;
              } while (uVar29 != local_58);
            }
            bVar24 = local_50->error_ != 0;
            output = local_60;
            nmemb = local_58;
            goto LAB_0014b0e4;
          }
        }
        CostManagerClear(manager);
      }
    }
LAB_0014b0e4:
    if (iVar8 != 0) {
      VP8LColorCacheClear(&local_88);
    }
    CostManagerClear(manager);
    WebPSafeFree(output);
    WebPSafeFree(manager);
    if (!bVar24) {
      puVar30 = ptr + nmemb;
      for (puVar14 = ptr + (nmemb - 1); ptr <= puVar14;
          puVar14 = (ushort *)((long)puVar14 - (ulong)((uint)uVar2 * 2))) {
        uVar2 = *puVar14;
        puVar30[-1] = uVar2;
        puVar30 = puVar30 + -1;
      }
      if ((cache_bits < 1) ||
         (iVar8 = VP8LColorCacheInit((VP8LColorCache *)&local_78,cache_bits), iVar8 != 0)) {
        VP8LClearBackwardRefs(refs_dst);
        uVar22 = (uint)((ulong)((long)(ptr + nmemb) - (long)puVar30) >> 1);
        if (0 < (int)uVar22) {
          uVar29 = 0;
          uVar12 = 0;
          do {
            uVar2 = puVar30[uVar29];
            uVar27 = (uint)uVar2;
            if ((ulong)uVar2 == 1) {
              if (cache_bits < 1) {
                uVar20 = 0xffffffff;
              }
              else {
                uVar20 = argb[uVar12] * 0x1e35a7bd >> ((byte)local_78.cur_block_ & 0x1f);
                if (*(uint32_t *)(&(local_78.cur_pos)->mode + (long)(int)uVar20 * 4) != argb[uVar12]
                   ) {
                  uVar20 = 0xffffffff;
                }
              }
              uVar15 = 0x10001;
              if ((int)uVar20 < 0) {
                if (0 < cache_bits) {
                  *(uint32_t *)
                   (&(local_78.cur_pos)->mode +
                   (long)(int)(argb[uVar12] * 0x1e35a7bd >> ((byte)local_78.cur_block_ & 0x1f)) * 4)
                       = argb[uVar12];
                }
                uVar20 = argb[uVar12];
                uVar15 = 0x10000;
              }
              VP8LBackwardRefsCursorAdd(refs_dst,(PixOrCopy)((ulong)uVar20 << 0x20 | uVar15));
              uVar27 = 1;
            }
            else {
              VP8LBackwardRefsCursorAdd
                        (refs_dst,(PixOrCopy)
                                  (((ulong)(local_48->offset_length_[uVar12] >> 0xc) << 0x20) +
                                   (ulong)uVar2 * 0x10000 + 2));
              if ((0 < cache_bits) && (uVar2 != 0)) {
                uVar15 = 0;
                do {
                  *(uint32_t *)
                   (&(local_78.cur_pos)->mode +
                   (long)(int)(argb[uVar12 + uVar15] * 0x1e35a7bd >>
                              ((byte)local_78.cur_block_ & 0x1f)) * 4) = argb[uVar12 + uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar2 != uVar15);
              }
            }
            uVar12 = (ulong)((int)uVar12 + uVar27);
            uVar29 = uVar29 + 1;
          } while (uVar29 != (uVar22 & 0x7fffffff));
        }
        uVar22 = (uint)(refs_dst->error_ == 0);
      }
      else {
        uVar22 = 0;
        bVar6 = true;
      }
      if (!bVar6) {
        VP8LColorCacheClear((VP8LColorCache *)&local_78);
      }
      goto LAB_0014b111;
    }
  }
  uVar22 = 0;
LAB_0014b111:
  WebPSafeFree(ptr);
  return uVar22;
}

Assistant:

int VP8LBackwardReferencesTraceBackwards(int xsize, int ysize,
                                         const uint32_t* const argb,
                                         int cache_bits,
                                         const VP8LHashChain* const hash_chain,
                                         const VP8LBackwardRefs* const refs_src,
                                         VP8LBackwardRefs* const refs_dst) {
  int ok = 0;
  const int dist_array_size = xsize * ysize;
  uint16_t* chosen_path = NULL;
  int chosen_path_size = 0;
  uint16_t* dist_array =
      (uint16_t*)WebPSafeMalloc(dist_array_size, sizeof(*dist_array));

  if (dist_array == NULL) goto Error;

  if (!BackwardReferencesHashChainDistanceOnly(
          xsize, ysize, argb, cache_bits, hash_chain, refs_src, dist_array)) {
    goto Error;
  }
  TraceBackwards(dist_array, dist_array_size, &chosen_path, &chosen_path_size);
  if (!BackwardReferencesHashChainFollowChosenPath(
          argb, cache_bits, chosen_path, chosen_path_size, hash_chain,
          refs_dst)) {
    goto Error;
  }
  ok = 1;
 Error:
  WebPSafeFree(dist_array);
  return ok;
}